

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-memory.c
# Opt level: O3

int run_test_get_memory(void)

{
  int iVar1;
  __uid_t _Var2;
  __gid_t _Var3;
  int extraout_EAX;
  int extraout_EAX_00;
  anon_union_8_2_bf76bca6_for_active_reqs aVar4;
  anon_union_8_2_bf76bca6_for_active_reqs aVar5;
  anon_union_8_2_bf76bca6_for_active_reqs aVar6;
  anon_union_8_2_bf76bca6_for_active_reqs extraout_RAX;
  uv_loop_t *puVar7;
  undefined8 uVar8;
  long extraout_RDX;
  addrinfo *ai;
  int iVar9;
  uv_getaddrinfo_t *__ptr;
  char *pcVar10;
  anon_union_8_2_bf76bca6_for_active_reqs aVar11;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_308 [24];
  void *pvStack_2f0;
  uv_getaddrinfo_t uStack_2e8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_248;
  undefined8 uStack_238;
  code *pcStack_230;
  long lStack_228;
  long lStack_220;
  uv_getaddrinfo_t uStack_218;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_178;
  size_t sStack_168;
  size_t sStack_160;
  uv_group_t uStack_158;
  uv_passwd_t uStack_140;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_110;
  size_t sStack_100;
  long lStack_f8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_f0;
  long lStack_e8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_d8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_d0;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_c0;
  uv_uid_t uStack_b8;
  undefined4 uStack_b4;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_a8;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_a0;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_90;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_88;
  anon_union_8_2_bf76bca6_for_active_reqs *paStack_80;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_78;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_70;
  anon_union_8_2_bf76bca6_for_active_reqs *paStack_68;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_60;
  char *pcStack_58;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_50;
  long lStack_48;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_40;
  anon_union_8_2_bf76bca6_for_active_reqs local_30;
  anon_union_8_2_bf76bca6_for_active_reqs local_28;
  
  aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198ca8;
  aVar4 = (anon_union_8_2_bf76bca6_for_active_reqs)uv_get_free_memory();
  aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198cb0;
  aVar5 = (anon_union_8_2_bf76bca6_for_active_reqs)uv_get_total_memory();
  aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198cb8;
  uv_get_constrained_memory();
  aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198cc0;
  aVar6 = (anon_union_8_2_bf76bca6_for_active_reqs)uv_get_available_memory();
  aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198cdd;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu, available_mem=%llu\n",aVar4.unused,
         aVar5.unused);
  local_30.unused = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
  if ((long)aVar4.unused < 1) {
    aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198d5a;
    local_28 = aVar4;
    run_test_get_memory_cold_1();
LAB_00198d5a:
    aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198d69;
    run_test_get_memory_cold_2();
LAB_00198d69:
    aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198d78;
    run_test_get_memory_cold_3();
  }
  else {
    local_30.unused = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
    local_28 = aVar5;
    if ((long)aVar5.unused < 1) goto LAB_00198d5a;
    local_30 = aVar4;
    if ((long)aVar5.unused <= (long)aVar4.unused) goto LAB_00198d69;
    local_30 = aVar5;
    local_28 = aVar6;
    if ((long)aVar6.unused <= (long)aVar5.unused) {
      return 0;
    }
  }
  aStack_40 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198d87;
  run_test_get_memory_cold_4();
  aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198d97;
  aStack_40 = aVar5;
  iVar1 = uv_os_get_passwd((uv_passwd_t *)&aStack_70);
  aStack_78 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
  paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
  if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_78.unused ==
      (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198dbf;
    aStack_78.unused = (void *)strlen(aStack_70.unused);
    paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
    if ((long)aStack_78.unused < 1) goto LAB_00198fd6;
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198de5;
    aStack_78 = (anon_union_8_2_bf76bca6_for_active_reqs)strlen(pcStack_58);
    aVar6 = aStack_50;
    paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
    if ((long)aStack_78.unused < 1) goto LAB_00198fe3;
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198e0e;
    aStack_78.unused = (void *)strlen(aStack_50.unused);
    paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x0;
    aVar5 = aVar6;
    if ((long)aStack_78.unused < 1) goto LAB_00198ff0;
    if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_78.unused !=
        (anon_union_8_2_bf76bca6_for_active_reqs *)0x1) {
LAB_00198e59:
      aStack_78 = (anon_union_8_2_bf76bca6_for_active_reqs)
                  (long)(char)((undefined1 *)((long)aVar6.unused + -1))[(long)aStack_78.unused];
      paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f;
      if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_78.unused !=
          (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f) goto LAB_00198e7b;
      goto LAB_00199059;
    }
    aStack_78 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)*aVar6.unused;
    paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0x2f;
    if (aStack_78.unused != (void *)0x2f) {
      aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198e59;
      run_test_get_passwd_cold_6();
      aStack_78 = extraout_RAX;
      goto LAB_00198e59;
    }
LAB_00198e7b:
    aStack_78.unused = paStack_68;
    paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff;
    if (paStack_68 == (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff) goto LAB_00198ffd;
    aStack_78.unused = aStack_60.unused;
    paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff;
    if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_60.unused ==
        (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffff) goto LAB_0019900a;
    aStack_78.unused = paStack_68;
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198ec4;
    _Var2 = geteuid();
    aVar6 = aStack_60;
    paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var2;
    if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_78.unused != paStack_80)
    goto LAB_00199017;
    if (paStack_68 == (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
LAB_00198f16:
      aVar6.unused = &aStack_70;
      aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198f23;
      uv_os_free_passwd((uv_passwd_t *)aVar6.unused);
      if ((char *)aStack_70.unused != (char *)0x0) goto LAB_00199024;
      if (pcStack_58 != (char *)0x0) goto LAB_00199029;
      if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_50.unused !=
          (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) goto LAB_0019902e;
      if (lStack_48 != 0) goto LAB_00199033;
      aVar6.unused = &aStack_70;
      aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198f66;
      uv_os_free_passwd((uv_passwd_t *)aVar6.unused);
      if ((char *)aStack_70.unused != (char *)0x0) goto LAB_00199038;
      if (pcStack_58 != (char *)0x0) goto LAB_0019903d;
      if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_50.unused !=
          (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) goto LAB_00199042;
      if (lStack_48 != 0) goto LAB_00199047;
      aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198fa3;
      iVar1 = uv_os_get_passwd((uv_passwd_t *)0x0);
      aStack_78 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
      paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffffffffffea;
      if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_78.unused ==
          (anon_union_8_2_bf76bca6_for_active_reqs *)0xffffffffffffffea) {
        return 0;
      }
      goto LAB_0019904c;
    }
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198eeb;
    _Var3 = getgid();
    if ((anon_union_8_2_bf76bca6_for_active_reqs *)aVar6.unused ==
        (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var3) goto LAB_00198f16;
    aStack_78.unused = aStack_60.unused;
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198f01;
    _Var3 = getegid();
    paStack_80 = (anon_union_8_2_bf76bca6_for_active_reqs *)(ulong)_Var3;
    if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_78.unused == paStack_80)
    goto LAB_00198f16;
  }
  else {
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198fd6;
    run_test_get_passwd_cold_1();
LAB_00198fd6:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198fe3;
    run_test_get_passwd_cold_2();
LAB_00198fe3:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198ff0;
    run_test_get_passwd_cold_3();
LAB_00198ff0:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x198ffd;
    run_test_get_passwd_cold_4();
LAB_00198ffd:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19900a;
    run_test_get_passwd_cold_19();
LAB_0019900a:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199017;
    run_test_get_passwd_cold_18();
LAB_00199017:
    aVar6 = aVar5;
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199024;
    run_test_get_passwd_cold_7();
LAB_00199024:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199029;
    run_test_get_passwd_cold_9();
LAB_00199029:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19902e;
    run_test_get_passwd_cold_10();
LAB_0019902e:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199033;
    run_test_get_passwd_cold_11();
LAB_00199033:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199038;
    run_test_get_passwd_cold_12();
LAB_00199038:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19903d;
    run_test_get_passwd_cold_13();
LAB_0019903d:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199042;
    run_test_get_passwd_cold_14();
LAB_00199042:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199047;
    run_test_get_passwd_cold_15();
LAB_00199047:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19904c;
    run_test_get_passwd_cold_16();
LAB_0019904c:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199059;
    run_test_get_passwd_cold_17();
LAB_00199059:
    aStack_88 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199066;
    run_test_get_passwd_cold_5();
  }
  aStack_88.unused = run_test_get_passwd2;
  run_test_get_passwd_cold_8();
  aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199084;
  aStack_90 = aVar6;
  aStack_88 = aVar4;
  iVar1 = uv_os_get_passwd((uv_passwd_t *)&aStack_c0);
  aStack_f0 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
  sStack_100 = 0;
  if ((anon_union_8_2_bf76bca6_for_active_reqs *)aStack_f0.unused ==
      (anon_union_8_2_bf76bca6_for_active_reqs *)0x0) {
    aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1990b2;
    iVar1 = uv_os_get_passwd2((uv_passwd_t *)&aStack_f0,uStack_b8);
    aVar5 = aStack_f0;
    sStack_100 = (size_t)iVar1;
    lStack_f8 = 0;
    if (sStack_100 != 0) goto LAB_00199270;
    sStack_100 = CONCAT44(uStack_b4,uStack_b8);
    lStack_f8 = lStack_e8;
    if (sStack_100 != lStack_e8) goto LAB_0019927f;
    aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19910b;
    iVar1 = strcmp((char *)aStack_c0.unused,(char *)aStack_f0.unused);
    aVar11 = aStack_d8;
    aVar6 = aStack_c0;
    aVar4 = aVar5;
    if (iVar1 == 0) {
      aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199128;
      iVar1 = strcmp((char *)aStack_a8.unused,(char *)aStack_d8.unused);
      aVar5 = aStack_d0;
      if (iVar1 != 0) {
        uStack_140.shell = "pwd2.shell";
        pcVar10 = "pwd.shell";
        uVar8 = 0x83;
        aStack_a0 = aStack_a8;
        goto LAB_00199328;
      }
      aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199145;
      iVar1 = strcmp((char *)aStack_a0.unused,(char *)aStack_d0.unused);
      if (iVar1 != 0) {
        uStack_140.shell = "pwd2.homedir";
        pcVar10 = "pwd.homedir";
        uVar8 = 0x84;
        aVar11 = aVar5;
        goto LAB_00199328;
      }
      aVar5.unused = &aStack_f0;
      aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19915a;
      uv_os_free_passwd((uv_passwd_t *)aVar5.unused);
      aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199164;
      iVar1 = uv_os_get_passwd2((uv_passwd_t *)aVar5.unused,0);
      aVar4 = aStack_f0;
      sStack_100 = (size_t)iVar1;
      lStack_f8 = 0;
      if (sStack_100 == 0) {
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199191;
        sStack_100 = strlen((char *)aStack_f0.unused);
        lStack_f8 = 0;
        aVar5 = aVar4;
        if ((long)sStack_100 < 1) goto LAB_0019934e;
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1991be;
        iVar1 = strcmp((char *)aVar4.unused,"root");
        if (iVar1 != 0) goto LAB_0019935d;
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1991d0;
        sStack_100 = strlen((char *)aStack_d0.unused);
        lStack_f8 = 0;
        if ((long)sStack_100 < 1) goto LAB_00199365;
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1991f8;
        sStack_100 = strlen((char *)aStack_d8.unused);
        lStack_f8 = 0;
        if ((long)sStack_100 < 1) goto LAB_00199374;
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199220;
        uv_os_free_passwd((uv_passwd_t *)&aStack_f0);
        aVar5.unused = &aStack_c0;
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19922d;
        uv_os_free_passwd((uv_passwd_t *)aVar5.unused);
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199237;
        iVar1 = uv_os_get_passwd2((uv_passwd_t *)0x0,uStack_b8);
        sStack_100 = (size_t)iVar1;
        lStack_f8 = 0xffffffffffffffea;
        if (sStack_100 == 0xffffffffffffffea) {
          return 0;
        }
      }
      else {
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19934e;
        run_test_get_passwd2_cold_4();
LAB_0019934e:
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19935d;
        run_test_get_passwd2_cold_5();
LAB_0019935d:
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199365;
        run_test_get_passwd2_cold_6();
LAB_00199365:
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199374;
        run_test_get_passwd2_cold_7();
LAB_00199374:
        aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199383;
        run_test_get_passwd2_cold_8();
      }
      aStack_110.unused = run_test_get_group;
      run_test_get_passwd2_cold_9();
      aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1993a1;
      aStack_110 = aVar5;
      iVar1 = uv_os_get_passwd(&uStack_140);
      uStack_158.groupname = (char *)(long)iVar1;
      sStack_168 = 0;
      if (uStack_158.groupname == (char *)0x0) {
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1993cf;
        iVar1 = uv_os_get_group(&uStack_158,(uv_uid_t)uStack_140.gid);
        sStack_168 = (size_t)iVar1;
        sStack_160 = 0;
        if (sStack_168 != 0) goto LAB_0019948b;
        sStack_168 = uStack_140.gid;
        sStack_160 = uStack_158.gid;
        if (uStack_140.gid != uStack_158.gid) goto LAB_0019949a;
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19941d;
        sStack_168 = strlen(uStack_158.groupname);
        sStack_160 = 0;
        if ((long)sStack_168 < 1) goto LAB_001994a9;
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199441;
        uv_os_free_group(&uStack_158);
        aVar5.unused = &uStack_140;
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19944e;
        uv_os_free_passwd((uv_passwd_t *)aVar5.unused);
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199458;
        iVar1 = uv_os_get_group((uv_group_t *)0x0,(uv_uid_t)uStack_140.gid);
        sStack_168 = (size_t)iVar1;
        sStack_160 = 0xffffffffffffffea;
        if (sStack_168 == 0xffffffffffffffea) {
          return 0;
        }
      }
      else {
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19948b;
        run_test_get_group_cold_1();
LAB_0019948b:
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19949a;
        run_test_get_group_cold_2();
LAB_0019949a:
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1994a9;
        run_test_get_group_cold_3();
LAB_001994a9:
        aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1994b8;
        run_test_get_group_cold_4();
      }
      aStack_178 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1994c7;
      run_test_get_group_cold_5();
      iVar9 = (int)&lStack_228;
      lStack_220 = -0x16;
      pcStack_230 = (code *)0x1994de;
      aStack_178 = aVar5;
      puVar7 = uv_default_loop();
      pcStack_230 = (code *)0x1994fa;
      iVar1 = uv_getaddrinfo(puVar7,&uStack_218,abort,(char *)0x0,(char *)0x0,(addrinfo *)0x0);
      lStack_228 = (long)iVar1;
      if (lStack_220 == lStack_228) {
        pcStack_230 = (code *)0x199514;
        puVar7 = uv_default_loop();
        pcStack_230 = (code *)0x199535;
        iVar1 = uv_getaddrinfo(puVar7,&uStack_218,getaddrinfo_fail_cb,"example.invalid.",(char *)0x0
                               ,(addrinfo *)0x0);
        lStack_220 = (long)iVar1;
        lStack_228 = 0;
        if (lStack_220 != 0) goto LAB_0019960a;
        pcStack_230 = (code *)0x199558;
        puVar7 = uv_default_loop();
        pcStack_230 = (code *)0x199562;
        iVar1 = uv_run(puVar7,UV_RUN_DEFAULT);
        lStack_220 = (long)iVar1;
        lStack_228 = 0;
        if (lStack_220 != 0) goto LAB_00199617;
        lStack_220 = 1;
        lStack_228 = (long)fail_cb_called;
        if (lStack_228 != 1) goto LAB_00199624;
        pcStack_230 = (code *)0x1995a8;
        aVar5.unused = uv_default_loop();
        pcStack_230 = (code *)0x1995bc;
        uv_walk((uv_loop_t *)aVar5.unused,close_walk_cb,(void *)0x0);
        pcStack_230 = (code *)0x1995c6;
        uv_run((uv_loop_t *)aVar5.unused,UV_RUN_DEFAULT);
        lStack_220 = 0;
        pcStack_230 = (code *)0x1995d4;
        puVar7 = uv_default_loop();
        pcStack_230 = (code *)0x1995dc;
        iVar1 = uv_loop_close(puVar7);
        lStack_228 = (long)iVar1;
        if (lStack_220 == lStack_228) {
          pcStack_230 = (code *)0x1995f2;
          uv_library_shutdown();
          return 0;
        }
      }
      else {
        pcStack_230 = (code *)0x19960a;
        run_test_getaddrinfo_fail_cold_1();
LAB_0019960a:
        pcStack_230 = (code *)0x199617;
        run_test_getaddrinfo_fail_cold_2();
LAB_00199617:
        pcStack_230 = (code *)0x199624;
        run_test_getaddrinfo_fail_cold_3();
LAB_00199624:
        pcStack_230 = (code *)0x199631;
        run_test_getaddrinfo_fail_cold_4();
      }
      pcStack_230 = getaddrinfo_fail_cb;
      run_test_getaddrinfo_fail_cold_5();
      pcStack_230 = (code *)(long)fail_cb_called;
      uStack_238 = 0;
      if (pcStack_230 == (code *)0x0) {
        pcStack_230 = (code *)(long)iVar9;
        uStack_238 = 0;
        if (-1 < (long)pcStack_230) goto LAB_001996a6;
        if (extraout_RDX == 0) {
          aStack_248 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19968c;
          uv_freeaddrinfo((addrinfo *)0x0);
          fail_cb_called = fail_cb_called + 1;
          return extraout_EAX;
        }
      }
      else {
        aStack_248 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1996a6;
        getaddrinfo_fail_cb_cold_1();
LAB_001996a6:
        aStack_248 = (anon_union_8_2_bf76bca6_for_active_reqs)0x1996b5;
        getaddrinfo_fail_cb_cold_2();
      }
      aStack_248.unused = run_test_getaddrinfo_fail_sync;
      getaddrinfo_fail_cb_cold_3();
      pvStack_2f0 = (void *)0x0;
      auStack_308._8_8_ = (uv_loop_t *)0x1996d3;
      aStack_248 = aVar5;
      puVar7 = uv_default_loop();
      auStack_308._8_8_ = (uv_loop_t *)0x1996ef;
      iVar1 = uv_getaddrinfo(puVar7,&uStack_2e8,(uv_getaddrinfo_cb)0x0,"example.invalid.",
                             (char *)0x0,(addrinfo *)0x0);
      auStack_308._16_8_ = SEXT48(iVar1);
      if ((long)auStack_308._16_8_ < (long)pvStack_2f0) {
        auStack_308._8_8_ = (uv_loop_t *)0x19970d;
        uv_freeaddrinfo(uStack_2e8.addrinfo);
        auStack_308._8_8_ = (uv_loop_t *)0x199712;
        aVar5.unused = uv_default_loop();
        auStack_308._8_8_ = (uv_loop_t *)0x199726;
        uv_walk((uv_loop_t *)aVar5.unused,close_walk_cb,(void *)0x0);
        auStack_308._8_8_ = (uv_loop_t *)0x199730;
        uv_run((uv_loop_t *)aVar5.unused,UV_RUN_DEFAULT);
        pvStack_2f0 = (void *)0x0;
        auStack_308._8_8_ = (uv_loop_t *)0x19973e;
        puVar7 = uv_default_loop();
        auStack_308._8_8_ = (uv_loop_t *)0x199746;
        iVar1 = uv_loop_close(puVar7);
        auStack_308._16_8_ = SEXT48(iVar1);
        if (pvStack_2f0 == (void *)auStack_308._16_8_) {
          auStack_308._8_8_ = (uv_loop_t *)0x19975c;
          uv_library_shutdown();
          return 0;
        }
      }
      else {
        auStack_308._8_8_ = (uv_loop_t *)0x199774;
        run_test_getaddrinfo_fail_sync_cold_1();
      }
      auStack_308._8_8_ = run_test_getaddrinfo_basic;
      run_test_getaddrinfo_fail_sync_cold_2();
      auStack_308._8_8_ = aVar5;
      getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
      puVar7 = uv_default_loop();
      iVar1 = uv_getaddrinfo(puVar7,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",(char *)0x0,
                             (addrinfo *)0x0);
      auStack_308._0_8_ = SEXT48(iVar1);
      if ((void *)auStack_308._0_8_ == (void *)0x0) {
        puVar7 = uv_default_loop();
        uv_run(puVar7,UV_RUN_DEFAULT);
        auStack_308._0_8_ = (void *)0x1;
        if (getaddrinfo_cbs == 1) {
          aVar5.unused = uv_default_loop();
          uv_walk((uv_loop_t *)aVar5.unused,close_walk_cb,(void *)0x0);
          uv_run((uv_loop_t *)aVar5.unused,UV_RUN_DEFAULT);
          auStack_308._0_8_ = (void *)0x0;
          puVar7 = uv_default_loop();
          iVar1 = uv_loop_close(puVar7);
          if ((void *)auStack_308._0_8_ == (void *)(long)iVar1) {
            uv_library_shutdown();
            return 0;
          }
          goto LAB_0019987c;
        }
      }
      else {
        run_test_getaddrinfo_basic_cold_1();
      }
      run_test_getaddrinfo_basic_cold_2();
LAB_0019987c:
      __ptr = (uv_getaddrinfo_t *)auStack_308;
      run_test_getaddrinfo_basic_cold_3();
      if (getaddrinfo_handle == __ptr) {
        getaddrinfo_cbs = getaddrinfo_cbs + 1;
        free(__ptr);
        uv_freeaddrinfo(ai);
        return extraout_EAX_00;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getaddrinfo.c"
              ,0x36,"handle","==","getaddrinfo_handle",__ptr,"==",getaddrinfo_handle,aVar5.unused);
      abort();
    }
  }
  else {
    aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x199270;
    run_test_get_passwd2_cold_1();
LAB_00199270:
    aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19927f;
    run_test_get_passwd2_cold_2();
LAB_0019927f:
    aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19928e;
    run_test_get_passwd2_cold_3();
  }
  aVar11 = aVar4;
  aStack_a0 = aVar6;
  uStack_140.shell = "pwd2.username";
  pcVar10 = "pwd.username";
  uVar8 = 0x82;
LAB_00199328:
  uStack_140.gecos = "==";
  uStack_140.gid = 0x199336;
  uStack_140.homedir = (char *)aStack_a0;
  aStack_110 = aVar11;
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%s %s %s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
          ,uVar8,pcVar10);
  aStack_110 = (anon_union_8_2_bf76bca6_for_active_reqs)0x19933f;
  abort();
}

Assistant:

TEST_IMPL(get_memory) {
  uint64_t free_mem = uv_get_free_memory();
  uint64_t total_mem = uv_get_total_memory();
  uint64_t constrained_mem = uv_get_constrained_memory();
  uint64_t available_mem = uv_get_available_memory();

  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu, "
         "available_mem=%llu\n",
         (unsigned long long) free_mem,
         (unsigned long long) total_mem,
         (unsigned long long) constrained_mem,
         (unsigned long long) available_mem);

  ASSERT_GT(free_mem, 0);
  ASSERT_GT(total_mem, 0);
  /* On IBMi PASE, the amount of memory in use is always zero. */
#ifdef __PASE__
  ASSERT_EQ(total_mem, free_mem);
#else
  ASSERT_GT(total_mem, free_mem);
#endif
  ASSERT_LE(available_mem, total_mem);
  /* we'd really want to test if available <= free, but that is fragile:
   * with no limit set, get_available calls and returns get_free; so if
   * any memory was freed between our calls to get_free and get_available
   * we would fail such a test test (as observed on CI).
   */
  return 0;
}